

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void eval_residual(double *coeffs,double *rgb,double *residual)

{
  undefined1 auVar1 [16];
  double dVar2;
  int i;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  double out [3];
  undefined1 local_38 [32];
  
  auVar8 = vpmovsxwq_avx2(ZEXT816(0x11b008d80000));
  local_38._16_8_ = 0;
  lVar3 = 0;
  local_38._0_16_ = ZEXT816(0);
  auVar5 = vpbroadcastq_avx512vl();
  do {
    lVar4 = 0;
    auVar12._0_8_ = (lambda_tbl[lVar3] + -360.0) / 470.0;
    auVar12._8_8_ = 0;
    auVar10 = ZEXT816(0);
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = coeffs[lVar4];
      auVar10 = vfmadd213sd_fma(auVar10,auVar12,auVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    auVar12 = vfmadd213sd_fma(auVar10,auVar10,ZEXT816(0x3ff0000000000000));
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    auVar6 = vpbroadcastq_avx512vl();
    lVar3 = lVar3 + 1;
    auVar6 = vpsllq_avx2(auVar6,3);
    auVar6 = vpaddq_avx2(auVar5,auVar6);
    vpaddq_avx2(auVar6,auVar8);
    auVar6 = vgatherqpd_avx512vl(*coeffs);
    auVar6._24_8_ = 0;
    auVar7._0_24_ = local_38._0_24_;
    auVar7._24_8_ = 0;
    dVar2 = (auVar10._0_8_ * 0.5) / auVar12._0_8_ + 0.5;
    auVar11._8_8_ = dVar2;
    auVar11._0_8_ = dVar2;
    auVar11._16_8_ = dVar2;
    auVar11._24_8_ = dVar2;
    auVar10 = vfmadd231pd_fma(auVar7,auVar11,auVar6);
    local_38._16_8_ = 0;
    local_38._0_16_ = auVar10;
  } while (lVar3 != 0x11b);
  cie_lab((double *)local_38);
  residual[2] = rgb[2];
  dVar2 = rgb[1];
  *residual = *rgb;
  residual[1] = dVar2;
  cie_lab(residual);
  auVar8._0_24_ = local_38._0_24_;
  auVar8._24_8_ = 0;
  auVar5._0_24_ = SUB3224(*(undefined1 (*) [32])residual,0);
  auVar5._24_8_ = 0;
  auVar8 = vsubpd_avx(auVar5,auVar8);
  auVar9._0_24_ = auVar8._0_24_;
  auVar9._24_8_ = residual[3];
  *(undefined1 (*) [32])residual = auVar9;
  return;
}

Assistant:

void eval_residual(const double *coeffs, const double *rgb, double *residual) {
    double out[3] = {0.0, 0.0, 0.0};

    for (int i = 0; i < CIE_FINE_SAMPLES; ++i) {
        /* Scale lambda to 0..1 range */
        double lambda =
            (lambda_tbl[i] - CIE_LAMBDA_MIN) / (CIE_LAMBDA_MAX - CIE_LAMBDA_MIN);

        /* Polynomial */
        double x = 0.0;
        for (int i = 0; i < 3; ++i)
            x = x * lambda + coeffs[i];

        /* Sigmoid */
        double s = sigmoid(x);

        /* Integrate against precomputed curves */
        for (int j = 0; j < 3; ++j)
            out[j] += rgb_tbl[j][i] * s;
    }
    cie_lab(out);
    memcpy(residual, rgb, sizeof(double) * 3);
    cie_lab(residual);

    for (int j = 0; j < 3; ++j)
        residual[j] -= out[j];
}